

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_cast.c
# Opt level: O2

value value_type_cast(value v,type_id id)

{
  type_id tVar1;
  int iVar2;
  void *data_00;
  size_t sVar3;
  value pvVar4;
  undefined8 *puVar5;
  size_t bytes;
  value pvVar6;
  float fVar7;
  double dVar8;
  type_id id_local;
  int64_t data;
  value v_local;
  
  id_local = id;
  v_local = v;
  tVar1 = value_type_id(v);
  iVar2 = type_id_invalid(tVar1);
  if ((iVar2 != 0) && (iVar2 = type_id_invalid(id), iVar2 != 0)) {
    if (tVar1 == id) {
      return v;
    }
    iVar2 = type_id_string(tVar1);
    if (iVar2 == 0) {
      return (value)0x0;
    }
    iVar2 = type_id_string(id);
    if (iVar2 == 0) {
      return (value)0x0;
    }
    iVar2 = type_id_null(tVar1);
    if (iVar2 == 0) {
      iVar2 = type_id_boolean(id);
      if (iVar2 != 0) {
        type_id_array(id);
        return v;
      }
      return v;
    }
    iVar2 = type_id_null(id);
    if (iVar2 == 0) {
      pvVar4 = value_create_null();
    }
    else {
      iVar2 = type_id_buffer(id);
      if ((7 < tVar1) || (iVar2 != 0)) {
        iVar2 = type_id_array(id);
        if ((tVar1 < 8) && (iVar2 == 0)) {
          pvVar4 = value_type_create(&v_local,8,9);
          if (pvVar4 == (value)0x0) {
            return (value)0x0;
          }
          value_type_destroy(v_local);
          return pvVar4;
        }
        iVar2 = type_id_array(tVar1);
        if ((7 < id || iVar2 != 0) || (sVar3 = value_type_size(v), sVar3 != 8)) {
          sVar3 = value_type_id_size(tVar1);
          bytes = value_type_id_size(id);
          if (tVar1 < id) {
            iVar2 = type_id_integer(tVar1);
            if ((iVar2 == 0) && (iVar2 = type_id_integer(id), iVar2 == 0)) {
              pvVar4 = value_type_promotion_integer(v,id);
              return pvVar4;
            }
            iVar2 = type_id_decimal(tVar1);
            if ((iVar2 == 0) && (iVar2 = type_id_decimal(id), iVar2 == 0)) {
              pvVar4 = value_type_promotion_decimal(v,id);
              return pvVar4;
            }
            iVar2 = type_id_integer(tVar1);
            if (iVar2 != 0) {
              return (value)0x0;
            }
            iVar2 = type_id_decimal(id);
            if (iVar2 != 0) {
              return (value)0x0;
            }
            data = 0;
            value_to(v,&data,sVar3);
            if (sVar3 == bytes) {
              value_from((value)(sVar3 + (long)v),&id_local,4);
              pvVar4 = v;
            }
            else {
              pvVar6 = value_type_create((void *)0x0,bytes,id_local);
              pvVar4 = (value)0x0;
              if (pvVar6 != (value)0x0) {
                value_type_destroy(v);
                pvVar4 = pvVar6;
              }
            }
            if (id_local != 6) {
              if (id_local != 5) {
                return (value)0x0;
              }
              pvVar4 = value_from_float(pvVar4,(float)data);
              return pvVar4;
            }
            pvVar4 = value_from_double(pvVar4,(double)data);
            return pvVar4;
          }
          if (tVar1 <= id) {
            return (value)0x0;
          }
          iVar2 = type_id_boolean(id);
          if (iVar2 == 0) {
            pvVar4 = value_type_demotion_boolean(v,id);
            return pvVar4;
          }
          iVar2 = type_id_integer(tVar1);
          if ((iVar2 == 0) && (iVar2 = type_id_integer(id), iVar2 == 0)) {
            pvVar4 = value_type_demotion_integer(v,id);
            return pvVar4;
          }
          iVar2 = type_id_decimal(tVar1);
          if ((iVar2 == 0) && (iVar2 = type_id_decimal(id), iVar2 == 0)) {
            pvVar4 = value_type_demotion_decimal(v,id);
            return pvVar4;
          }
          iVar2 = type_id_decimal(tVar1);
          if (iVar2 != 0) {
            return (value)0x0;
          }
          iVar2 = type_id_integer(id);
          if (iVar2 != 0) {
            return (value)0x0;
          }
          if (tVar1 == 6) {
            dVar8 = value_to_double(v);
            data = (int64_t)dVar8;
          }
          else {
            if (tVar1 != 5) {
              return (value)0x0;
            }
            fVar7 = value_to_float(v);
            data = (int64_t)fVar7;
          }
          if (sVar3 == bytes) {
            value_from((value)(sVar3 + (long)v),&id_local,4);
            pvVar4 = v;
          }
          else {
            pvVar6 = value_type_create((void *)0x0,bytes,id);
            pvVar4 = (value)0x0;
            if (pvVar6 != (value)0x0) {
              value_type_destroy(v);
              pvVar4 = pvVar6;
            }
          }
          pvVar4 = value_from(pvVar4,&data,bytes);
          return pvVar4;
        }
        puVar5 = (undefined8 *)value_data(v);
        pvVar4 = (value)*puVar5;
        if (pvVar4 == (value)0x0) {
          return (value)0x0;
        }
        tVar1 = value_type_id(pvVar4);
        if (((tVar1 != id) && (tVar1 = value_type_id(pvVar4), tVar1 < 8)) &&
           (pvVar4 = value_type_cast(pvVar4,id), pvVar4 == (value)0x0)) {
          return (value)0x0;
        }
        goto LAB_0010a9e1;
      }
      data_00 = value_data(v);
      sVar3 = value_type_id_size(tVar1);
      pvVar4 = value_type_create(data_00,sVar3,8);
    }
    if (pvVar4 != (value)0x0) {
LAB_0010a9e1:
      value_type_destroy(v);
      return pvVar4;
    }
  }
  return (value)0x0;
}

Assistant:

value value_type_cast(value v, type_id id)
{
	type_id src_id = value_type_id(v);

	size_t src_size, dest_size;

	/* Invalid source value type */
	if (type_id_invalid(src_id) == 0 || type_id_invalid(id) == 0)
	{
		return NULL;
	}

	/* Equal types, avoid casting */
	if (src_id == id)
	{
		return v;
	}

	/* Cast from string to any type */
	if (type_id_string(src_id) == 0)
	{
		/*return value_type_parse(v, id);*/

		return NULL;
	}

	/* Cast from any type to string */
	if (type_id_string(id) == 0)
	{
		/*return value_type_stringify(v);*/

		return NULL;
	}

	/* TODO: Cast from null value */
	if (type_id_null(src_id) == 0)
	{
		if (type_id_boolean(id) == 0)
		{
			/* TODO: Create boolean set to false */
			/*
			return value_type_create_bool
			*/
		}
		/*
		...
		*/
		else if (type_id_array(id) == 0)
		{
			/* TODO: Create an empty array */
			/*
			return value_type_create_bool
			*/
		}

		return v;
	}

	/* Cast to null value  */
	if (type_id_null(id) == 0)
	{
		value dest = value_create_null();

		if (dest == NULL)
		{
			return NULL;
		}

		value_type_destroy(v);

		return dest;
	}

	/* Convert single value to buffer */
	if (type_id_buffer(id) == 0 && src_id < TYPE_BUFFER)
	{
		value dest = value_type_create(value_data(v), value_type_id_size(src_id), TYPE_BUFFER);

		if (dest == NULL)
		{
			return NULL;
		}

		value_type_destroy(v);

		return dest;
	}

	/* TODO: Convert buffer to array */

	/* TODO: Convert buffer of size 1 to a single type */

	/* Convert single value to array */
	if (type_id_array(id) == 0 && src_id < TYPE_BUFFER)
	{
		value dest = value_type_create(&v, sizeof(value), TYPE_ARRAY);

		if (dest == NULL)
		{
			return NULL;
		}

		value_type_destroy(v);

		return dest;
	}

	/* TODO: Convert array to buffer */

	/* Convert array of size 1 to a single type */
	if (type_id_array(src_id) == 0 && id < TYPE_BUFFER && value_type_size(v) == sizeof(value))
	{
		value *values = value_data(v);

		value dest = values[0];

		if (dest == NULL)
		{
			return NULL;
		}

		if (value_type_id(dest) != id && value_type_id(dest) < TYPE_BUFFER)
		{
			value cast = value_type_cast(dest, id);

			if (cast == NULL)
			{
				return NULL;
			}

			dest = cast;
		}

		value_type_destroy(v);

		return dest;
	}

	/* TODO: Map */

	src_size = value_type_id_size(src_id);

	dest_size = value_type_id_size(id);

	/* Promote value type */
	if (src_id < id)
	{
		if (type_id_integer(src_id) == 0 && type_id_integer(id) == 0)
		{
			return value_type_promotion_integer(v, id);
		}

		if (type_id_decimal(src_id) == 0 && type_id_decimal(id) == 0)
		{
			return value_type_promotion_decimal(v, id);
		}

		if (type_id_integer(src_id) == 0 && type_id_decimal(id) == 0)
		{
			value dest = NULL;

			int64_t data = 0L;

			value_to(v, &data, src_size);

			if (src_size == dest_size)
			{
				value_from((value)(((uintptr_t)v) + src_size), &id, sizeof(type_id));

				dest = v;
			}
			else
			{
				dest = value_type_create(NULL, dest_size, id);

				if (dest != NULL)
				{
					value_type_destroy(v);
				}
			}

			if (id == TYPE_FLOAT)
			{
				float f = (float)data;

				return value_from_float(dest, f);
			}
			else if (id == TYPE_DOUBLE)
			{
				double d = (double)data;

				return value_from_double(dest, d);
			}

			return NULL;
		}

		return NULL;
	}

	/* Demote value type */
	if (src_id > id)
	{
		if (type_id_boolean(id) == 0)
		{
			return value_type_demotion_boolean(v, id);
		}

		if (type_id_integer(src_id) == 0 && type_id_integer(id) == 0)
		{
			return value_type_demotion_integer(v, id);
		}

		if (type_id_decimal(src_id) == 0 && type_id_decimal(id) == 0)
		{
			return value_type_demotion_decimal(v, id);
		}

		if (type_id_decimal(src_id) == 0 && type_id_integer(id) == 0)
		{
			value dest = NULL;

			int64_t data = 0L;

			if (src_id == TYPE_FLOAT)
			{
				data = (int64_t)value_to_float(v);
			}
			else if (src_id == TYPE_DOUBLE)
			{
				data = (int64_t)value_to_double(v);
			}
			else
			{
				return NULL;
			}

			if (src_size == dest_size)
			{
				value_from((value)(((uintptr_t)v) + src_size), &id, sizeof(type_id));

				dest = v;
			}
			else
			{
				dest = value_type_create(NULL, dest_size, id);

				if (dest != NULL)
				{
					value_type_destroy(v);
				}
			}

			return value_from(dest, &data, dest_size);
		}

		return NULL;
	}

	return NULL;
}